

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

Error * ot::commissioner::utils::ParseInteger<int>
                  (Error *__return_storage_ptr__,int *aInteger,string *aStr)

{
  ulonglong uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  char *endPtr;
  string local_88;
  char *local_68;
  ErrorCode local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  pointer local_38;
  size_type sStack_30;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_68 = (pointer)0x0;
  uVar1 = strtoull((aStr->_M_dataplus)._M_p,&local_68,0);
  if ((local_68 == (pointer)0x0) || (local_68 != (aStr->_M_dataplus)._M_p + aStr->_M_string_length))
  {
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_38 = (aStr->_M_dataplus)._M_p;
    sStack_30 = aStr->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x19;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)"{} is not a valid integer",fmt,args);
    local_60 = kInvalidArgs;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    __return_storage_ptr__->mCode = local_60;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_58);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  else {
    *aInteger = (int)uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Error ParseInteger(T &aInteger, const std::string &aStr)
{
    Error    error;
    uint64_t integer;
    char    *endPtr = nullptr;

    integer = strtoull(aStr.c_str(), &endPtr, 0);

    VerifyOrExit(endPtr != nullptr && endPtr == aStr.c_str() + aStr.length(),
                 error = ERROR_INVALID_ARGS("{} is not a valid integer", aStr));

    aInteger = integer;

exit:
    return error;
}